

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insert_ordered.h
# Opt level: O2

pair<std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>,_bool> __thiscall
wasm::InsertOrderedMap<CFG::Block_*,_CFG::Branch_*>::insert
          (InsertOrderedMap<CFG::Block_*,_CFG::Branch_*> *this,
          pair<CFG::Block_*const,_CFG::Branch_*> *kv)

{
  _List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_> _Var1;
  pair<std::__detail::_Node_iterator<std::pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>_>,_false,_false>,_bool>
  pVar2;
  pair<std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>,_bool> pVar3;
  
  pVar2 = std::
          _Hashtable<CFG::Block*,std::pair<CFG::Block*const,std::_List_iterator<std::pair<CFG::Block*const,CFG::Branch*>>>,std::allocator<std::pair<CFG::Block*const,std::_List_iterator<std::pair<CFG::Block*const,CFG::Branch*>>>>,std::__detail::_Select1st,std::equal_to<CFG::Block*>,std::hash<CFG::Block*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::
          _M_emplace<std::pair<CFG::Block*const,std::_List_iterator<std::pair<CFG::Block*const,CFG::Branch*>>>>
                    ();
  pVar3._8_4_ = pVar2._8_4_;
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    _Var1._M_node =
         *(_List_node_base **)
          ((long)pVar2.first.
                 super__Node_iterator_base<std::pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>_>,_false>
                 ._M_cur.
                 super__Node_iterator_base<std::pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>_>,_false>
          + 0x10);
  }
  else {
    std::__cxx11::
    list<std::pair<CFG::Block_*const,_CFG::Branch_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>_>
    ::push_back(&this->List,kv);
    _Var1 = std::prev<std::_List_iterator<std::pair<CFG::Block*const,CFG::Branch*>>>
                      ((_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>)&this->List,1);
    *(_List_node_base **)
     ((long)pVar2.first.
            super__Node_iterator_base<std::pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>_>,_false>
            ._M_cur.
            super__Node_iterator_base<std::pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>_>,_false>
     + 0x10) = _Var1._M_node;
  }
  pVar3.first._M_node = _Var1._M_node;
  pVar3._12_4_ = 0;
  return pVar3;
}

Assistant:

std::pair<iterator, bool> insert(const std::pair<const Key, T>& kv) {
    // Try inserting with a placeholder list iterator.
    auto inserted = Map.insert({kv.first, List.end()});
    if (inserted.second) {
      // This is a new item; insert it in the list and update the iterator.
      List.push_back(kv);
      inserted.first->second = std::prev(List.end());
    }
    return {inserted.first->second, inserted.second};
  }